

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

bool __thiscall QFileDialogPrivate::restoreFromSettings(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  QArrayData *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  ViewMode VVar7;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *this_01;
  Type *pTVar8;
  char *pcVar9;
  QStringList *__range1;
  long lVar10;
  ViewMode mode;
  bool *pbVar11;
  QString *urlStr;
  QString *pQVar12;
  long in_FS_OFFSET;
  QLatin1String QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  bool ok;
  QUrl url;
  QArrayDataPointer<QString> local_118;
  QArrayDataPointer<QString> local_f8;
  char local_d9;
  undefined1 local_d8 [16];
  QArrayData *local_c8;
  bool *pbStack_c0;
  undefined1 *local_b8;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 local_58 [32];
  long local_38;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_02;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = (QArrayData *)0x0;
  local_58._8_8_ = L"QtProject";
  local_58._16_8_ = 9;
  local_78._16_8_ = 0;
  local_78.shared = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  QSettings::QSettings
            ((QSettings *)&local_a8,UserScope,(QString *)local_58,(QString *)local_78.data,
             (QObject *)0x0);
  if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78.shared = *(int *)local_78.shared + -1;
    UNLOCK();
    if (*(int *)local_78.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_78.shared,2,0x10);
    }
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  QSettings::childGroups();
  QVar13.m_data = "FileDialog";
  QVar13.m_size = 10;
  cVar4 = QtPrivate::QStringList_contains((QList_conflict *)local_58,QVar13,CaseSensitive);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
  if (cVar4 == '\0') {
    bVar5 = false;
  }
  else {
    this_02.m_data = &local_a8;
    QVar14.m_size = (size_t)"FileDialog";
    QVar14.field_0.m_data = this_02.m_data;
    QSettings::beginGroup(QVar14);
    this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *
              )QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
               operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                           *)this_02.m_data_utf8);
    cVar4 = QUrl::isEmpty();
    if (cVar4 == '\0') {
      pTVar8 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
               operator()(this_01);
      QUrl::QUrl((QUrl *)&local_78.shared,pTVar8);
    }
    else {
      QVar15.m_size = (size_t)&local_a8;
      QVar15.field_0.m_data = local_58;
      QSettings::value(QVar15);
      ::QVariant::toUrl();
    }
    QFileDialog::setDirectoryUrl(this_00,(QUrl *)&local_78.shared);
    QUrl::~QUrl((QUrl *)&local_78.shared);
    if (cVar4 != '\0') {
      ::QVariant::~QVariant((QVariant *)local_58);
    }
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pbStack_c0 = (bool *)&DAT_aaaaaaaaaaaaaaaa;
    QVar16.m_size = (size_t)&local_a8;
    QVar16.field_0.m_data = &local_78;
    QSettings::value(QVar16);
    ::QVariant::toString();
    QString::toLatin1_helper_inplace((QString *)&local_c8);
    if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_98.shared = *(int *)local_98.shared + -1;
      UNLOCK();
      if (*(int *)local_98.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_98.shared,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_78);
    iVar6 = (*(code *)**(undefined8 **)&(this_00->super_QDialog).super_QWidget)(this_00);
    pcVar9 = (char *)(*(code *)**(undefined8 **)&(this_00->super_QDialog).super_QWidget)(this_00);
    QMetaObject::indexOfEnumerator(pcVar9);
    local_d8 = QMetaObject::enumerator(iVar6);
    local_d9 = '\0';
    pbVar11 = pbStack_c0;
    if (pbStack_c0 == (bool *)0x0) {
      pbVar11 = (bool *)&QByteArray::_empty;
    }
    VVar7 = QMetaEnum::keyToValue(local_d8,pbVar11);
    mode = List;
    if (local_d9 != '\0') {
      mode = VVar7;
    }
    QFileDialog::setViewMode(this_00,mode);
    QVar17.m_size = (size_t)&local_a8;
    QVar17.field_0.m_data = &local_78;
    QSettings::value(QVar17);
    ::QVariant::toStringList();
    QUrl::fromStringList((QList_conflict *)&local_f8,(ParsingMode)&local_118);
    qVar2 = local_f8.size;
    pQVar12 = local_f8.ptr;
    pDVar3 = local_f8.d;
    local_f8.size = 0;
    local_f8.d = (Data *)0x0;
    local_f8.ptr = (QString *)0x0;
    local_98.shared = (PrivateShared *)(this->sidebarUrls).d.d;
    local_98._8_8_ = (this->sidebarUrls).d.ptr;
    (this->sidebarUrls).d.d = (Data *)pDVar3;
    (this->sidebarUrls).d.ptr = (QUrl *)pQVar12;
    local_98._16_8_ = (this->sidebarUrls).d.size;
    (this->sidebarUrls).d.size = qVar2;
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_98);
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_f8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_118);
    ::QVariant::~QVariant((QVariant *)&local_78);
    QVar18.m_size = (size_t)&local_a8;
    QVar18.field_0.m_data = &local_78;
    QSettings::value(QVar18);
    ::QVariant::toByteArray();
    pQVar1 = &((this->headerData).d.d)->super_QArrayData;
    pcVar9 = (this->headerData).d.ptr;
    (this->headerData).d.d = (Data *)local_98.shared;
    (this->headerData).d.ptr = (char *)local_98._8_8_;
    qVar2 = (this->headerData).d.size;
    (this->headerData).d.size = local_98._16_8_;
    local_98.shared = (PrivateShared *)pQVar1;
    local_98._8_8_ = pcVar9;
    local_98._16_8_ = qVar2;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_78);
    bVar5 = true;
    if (((this->super_QDialogPrivate).nativeDialogInUse == false) &&
       ((this->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) {
      local_f8.d = (Data *)0x0;
      local_f8.ptr = (QString *)0x0;
      local_f8.size = 0;
      local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QVar19.m_size = (size_t)&local_a8;
      QVar19.field_0.m_data = &local_78;
      QSettings::value(QVar19);
      ::QVariant::toStringList();
      ::QVariant::~QVariant((QVariant *)&local_78);
      if ((undefined1 *)local_118.size != (undefined1 *)0x0) {
        lVar10 = local_118.size * 0x18;
        pQVar12 = local_118.ptr;
        do {
          local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QUrl::QUrl((QUrl *)&local_98.shared,(QString *)pQVar12,TolerantMode);
          cVar4 = QUrl::isLocalFile();
          if (cVar4 != '\0') {
            QUrl::toLocalFile();
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)&local_78);
            QList<QString>::end((QList<QString> *)&local_f8);
            if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_78.shared = *(int *)local_78.shared + -1;
              UNLOCK();
              if (*(int *)local_78.shared == 0) {
                QArrayData::deallocate((QArrayData *)local_78.shared,2,0x10);
              }
            }
          }
          QUrl::~QUrl((QUrl *)&local_98.shared);
          pQVar12 = pQVar12 + 1;
          lVar10 = lVar10 + -0x18;
        } while (lVar10 != 0);
      }
      ::QVariant::QVariant((QVariant *)&local_98,-1);
      QVar20.m_size = (size_t)&local_a8;
      QVar20.field_0.m_data_utf8 = (char *)&local_78;
      QSettings::value(QVar20,(QVariant *)"sidebarWidth");
      iVar6 = ::QVariant::toInt((bool *)local_78.data);
      bVar5 = restoreWidgetState(this,(QStringList *)&local_f8,iVar6);
      ::QVariant::~QVariant((QVariant *)&local_78);
      ::QVariant::~QVariant((QVariant *)&local_98);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
    }
    if (local_c8 != (QArrayData *)0x0) {
      LOCK();
      (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_c8,1,0x10);
      }
    }
  }
  QSettings::~QSettings((QSettings *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialogPrivate::restoreFromSettings()
{
    Q_Q(QFileDialog);
    QSettings settings(QSettings::UserScope, u"QtProject"_s);
    if (!settings.childGroups().contains("FileDialog"_L1))
        return false;
    settings.beginGroup("FileDialog");

    q->setDirectoryUrl(lastVisitedDir()->isEmpty() ? settings.value("lastVisited").toUrl() : *lastVisitedDir());

    QByteArray viewModeStr = settings.value("viewMode").toString().toLatin1();
    const QMetaEnum &viewModeMeta = q->metaObject()->enumerator(q->metaObject()->indexOfEnumerator("ViewMode"));
    bool ok = false;
    int viewMode = viewModeMeta.keyToValue(viewModeStr.constData(), &ok);
    if (!ok)
        viewMode = QFileDialog::List;
    q->setViewMode(static_cast<QFileDialog::ViewMode>(viewMode));

    sidebarUrls = QUrl::fromStringList(settings.value("shortcuts").toStringList());
    headerData = settings.value("treeViewHeader").toByteArray();

    if (!usingWidgets())
        return true;

    QStringList history;
    const auto urlStrings = settings.value("history").toStringList();
    for (const QString &urlStr : urlStrings) {
        QUrl url(urlStr);
        if (url.isLocalFile())
            history << url.toLocalFile();
    }

    return restoreWidgetState(history, settings.value("sidebarWidth", -1).toInt());
}